

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_header(gdIOCtx *infile,bmp_hdr_t *hdr)

{
  int iVar1;
  bmp_hdr_t *hdr_local;
  gdIOCtx *infile_local;
  
  iVar1 = gdGetWordLSB(&hdr->magic,infile);
  if ((((iVar1 != 0) && (iVar1 = gdGetIntLSB(&hdr->size,infile), iVar1 != 0)) &&
      (iVar1 = gdGetWordLSB(&hdr->reserved1,infile), iVar1 != 0)) &&
     ((iVar1 = gdGetWordLSB(&hdr->reserved2,infile), iVar1 != 0 &&
      (iVar1 = gdGetIntLSB(&hdr->off,infile), iVar1 != 0)))) {
    return 0;
  }
  return 1;
}

Assistant:

static int bmp_read_header(gdIOCtx *infile, bmp_hdr_t *hdr)
{
	if(
	    !gdGetWordLSB(&hdr->magic, infile) ||
	    !gdGetIntLSB(&hdr->size, infile) ||
	    !gdGetWordLSB(&hdr->reserved1, infile) ||
	    !gdGetWordLSB(&hdr->reserved2 , infile) ||
	    !gdGetIntLSB(&hdr->off , infile)
	) {
		return 1;
	}
	return 0;
}